

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,unsigned_int&,unsigned_int&,kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugExpression<bool> *params,uint *params_1,uint *params_2,MaybeUint *params_3,
          MaybeUint *params_4)

{
  undefined4 in_register_00000014;
  uint *params_00;
  uint *params_01;
  MaybeUint *params_02;
  MaybeUint *params_03;
  ArrayDisposer **local_110;
  undefined1 local_a8 [8];
  String argValues [5];
  char *macroArgs_local;
  char *condition_local;
  Type code_local;
  int line_local;
  char *file_local;
  Fault *this_local;
  
  this->exception = (Exception *)0x0;
  argValues[4].content.disposer = (ArrayDisposer *)macroArgs;
  str<kj::_::DebugExpression<bool>&>
            ((String *)local_a8,(kj *)params,
             (DebugExpression<bool> *)CONCAT44(in_register_00000014,line));
  str<unsigned_int&>((String *)&argValues[0].content.disposer,(kj *)params_1,params_00);
  str<unsigned_int&>((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  str<kj::_::BTreeImpl::MaybeUint&>
            ((String *)&argValues[2].content.disposer,(kj *)params_3,params_02);
  str<kj::_::BTreeImpl::MaybeUint&>
            ((String *)&argValues[3].content.disposer,(kj *)params_4,params_03);
  arrayPtr<kj::String>((String *)local_a8,5);
  init(this,(EVP_PKEY_CTX *)file);
  local_110 = &argValues[4].content.disposer;
  do {
    local_110 = local_110 + -3;
    String::~String((String *)local_110);
  } while (local_110 != (ArrayDisposer **)local_a8);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}